

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::validate_data_invariants
          (flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
           *this)

{
  ushort *puVar1;
  header_type_const_ptr unaligned_e;
  default_validate_element_fn<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
  *in_R8;
  undefined1 local_38 [8];
  pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>_>
  local_30;
  
  puVar1 = (ushort *)(this->buffer_).v2_.last;
  if (puVar1 == (ushort *)0x0) {
    return;
  }
  flat_forward_list_validate_no_next_offset<pod_array_list_entry<char>,flat_forward_list_traits_unaligned<char>,iffl::default_validate_element_fn<pod_array_list_entry<char>,flat_forward_list_traits_unaligned<char>>>
            (&local_30,(iffl *)(this->buffer_).v2_.begin,(char *)((long)puVar1 + (ulong)*puVar1 + 2)
             ,local_38,in_R8);
  if ((local_30.first != false) &&
     (flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>::
      last((flat_forward_list_ref<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>_>
            *)local_38), local_38 == (undefined1  [8])(this->buffer_).v2_.last)) {
    return;
  }
  std::terminate();
}

Assistant:

void validate_data_invariants() const noexcept {
#ifdef FFL_DBG_CHECK_DATA_VALID
        if (buff().last) {
            size_with_padding_t const last_element_size = traits_traits::get_size(buff().last);
            //
            // For element types that have offset of next element use entire buffer for validation
            // for element types that do not have offset to the next element, we have to limit 
            // by the end of the last element.
            // If there is sufficient reservation after last element then validate would not know 
            // where to stop, and might fail.
            //
            size_type buffer_length{ 0 };
            if constexpr (traits_traits::has_next_offset_v) {
                buffer_length = static_cast<size_type>(buff().end - buff().begin);
            } else {
                buffer_length = static_cast<size_type>(buff().last - buff().begin) + last_element_size.size;
            }

            size_type const last_element_offset{ static_cast<size_type>(buff().last - buff().begin) };
            FFL_CODDING_ERROR_IF(buffer_length < (last_element_offset + last_element_size.size));

            auto const [valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, buff().begin + buffer_length);
            FFL_CODDING_ERROR_IF_NOT(valid);
            FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
        }
#endif //FFL_DBG_CHECK_DATA_VALID
    }